

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_gltf.h
# Opt level: O1

bool tinygltf::ParseAudioEmitter
               (AudioEmitter *emitter,string *err,json *o,
               bool store_original_json_for_extras_and_extensions)

{
  ostream *poVar1;
  char cVar2;
  bool bVar3;
  int iVar4;
  reference pbVar5;
  string *psVar6;
  undefined7 in_register_00000009;
  json *extraout_RDX;
  json *extraout_RDX_00;
  json *extraout_RDX_01;
  json *extraout_RDX_02;
  json *extraout_RDX_03;
  json *extraout_RDX_04;
  json *pjVar7;
  pointer pcVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  undefined1 required;
  string *parent_node;
  stringstream ss;
  json_const_iterator positionalIt;
  string local_210;
  undefined4 local_1ec;
  undefined1 local_1e8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d8 [7];
  ios_base local_168 [272];
  json_const_iterator local_58;
  
  local_1ec = (undefined4)
              CONCAT71(in_register_00000009,store_original_json_for_extras_and_extensions);
  local_1e8._0_8_ = local_1e8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1e8,"type","");
  local_210._M_string_length = 0;
  local_210.field_2._M_local_buf[0] = '\0';
  local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
  bVar3 = ParseStringProperty(&emitter->type,err,o,(string *)local_1e8,true,&local_210);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    operator_delete(local_210._M_dataplus._M_p);
  }
  poVar1 = (ostream *)(local_1e8 + 0x10);
  if ((ostream *)local_1e8._0_8_ != poVar1) {
    operator_delete((void *)local_1e8._0_8_);
  }
  if (bVar3) {
    iVar4 = std::__cxx11::string::compare((char *)&emitter->type);
    paVar9 = &local_210.field_2;
    if (iVar4 != 0) {
LAB_0011c20d:
      pcVar8 = local_1e8 + 0x10;
      paVar9 = &local_210.field_2;
      local_1e8._0_8_ = pcVar8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1e8,"name","");
      local_210._M_string_length = 0;
      local_210.field_2._M_local_buf[0] = '\0';
      local_210._M_dataplus._M_p = (pointer)paVar9;
      ParseStringProperty(&emitter->name,err,o,(string *)local_1e8,false,&local_210);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_210._M_dataplus._M_p != paVar9) {
        operator_delete(local_210._M_dataplus._M_p);
      }
      if ((pointer)local_1e8._0_8_ != pcVar8) {
        operator_delete((void *)local_1e8._0_8_);
      }
      local_1e8._0_8_ = pcVar8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1e8,"gain","");
      local_210._M_dataplus._M_p = (pointer)paVar9;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,"");
      psVar6 = (string *)local_1e8;
      parent_node = &local_210;
      required = 0;
      ParseNumberProperty(&emitter->gain,err,o,psVar6,false,parent_node);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_210._M_dataplus._M_p != paVar9) {
        operator_delete(local_210._M_dataplus._M_p);
      }
      if ((pointer)local_1e8._0_8_ != pcVar8) {
        operator_delete((void *)local_1e8._0_8_);
      }
      local_1e8._0_8_ = pcVar8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1e8,"loop","");
      local_210._M_dataplus._M_p = (pointer)paVar9;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,"");
      ParseBooleanProperty
                (&emitter->loop,(string *)o,(json *)local_1e8,psVar6,(bool)required,parent_node);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_210._M_dataplus._M_p != paVar9) {
        operator_delete(local_210._M_dataplus._M_p);
      }
      if ((pointer)local_1e8._0_8_ != pcVar8) {
        operator_delete((void *)local_1e8._0_8_);
      }
      local_1e8._0_8_ = pcVar8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1e8,"playing","");
      local_210._M_dataplus._M_p = (pointer)paVar9;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,"");
      ParseBooleanProperty
                (&emitter->playing,(string *)o,(json *)local_1e8,psVar6,(bool)required,parent_node);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_210._M_dataplus._M_p != paVar9) {
        operator_delete(local_210._M_dataplus._M_p);
      }
      if ((pointer)local_1e8._0_8_ != pcVar8) {
        operator_delete((void *)local_1e8._0_8_);
      }
      local_1e8._0_8_ = pcVar8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1e8,"distanceModel","");
      local_210._M_string_length = 0;
      local_210.field_2._M_local_buf[0] = '\0';
      local_210._M_dataplus._M_p = (pointer)paVar9;
      ParseStringProperty(&emitter->distanceModel,err,o,(string *)local_1e8,false,&local_210);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_210._M_dataplus._M_p != paVar9) {
        operator_delete(local_210._M_dataplus._M_p);
      }
      if ((pointer)local_1e8._0_8_ != pcVar8) {
        operator_delete((void *)local_1e8._0_8_);
      }
      local_1e8._0_8_ = pcVar8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1e8,"source","");
      local_210._M_dataplus._M_p = (pointer)paVar9;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,"");
      ParseIntegerProperty(&emitter->source,err,o,(string *)local_1e8,true,&local_210);
      pjVar7 = extraout_RDX;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_210._M_dataplus._M_p != paVar9) {
        operator_delete(local_210._M_dataplus._M_p);
        pjVar7 = extraout_RDX_00;
      }
      if ((pointer)local_1e8._0_8_ != pcVar8) {
        operator_delete((void *)local_1e8._0_8_);
        pjVar7 = extraout_RDX_01;
      }
      ParseExtensionsProperty(&emitter->extensions,(string *)o,pjVar7);
      ParseExtrasProperty(&emitter->extras,o);
      if ((char)local_1ec != '\0') {
        local_1d8[0]._M_allocated_capacity._0_5_ = 0;
        local_1d8[0]._M_local_buf[5] = '\0';
        local_1d8[0]._M_local_buf[6] = '\0';
        local_1e8._0_8_ = (pointer)0x0;
        local_1e8._8_8_ = (object_t *)0x0;
        local_1d8[0]._7_4_ = 0;
        local_1d8[0]._M_local_buf[0xb] = '\0';
        local_1d8[0]._M_local_buf[0xc] = '\0';
        local_1d8[0]._M_local_buf[0xd] = '\0';
        local_1d8[0]._M_local_buf[0xe] = '\0';
        local_1d8[0]._M_local_buf[0xf] = -0x80;
        bVar3 = detail::FindMember(o,"extensions",(json_const_iterator *)local_1e8);
        if (bVar3) {
          pbVar5 = nlohmann::detail::
                   iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                   ::operator*((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                *)local_1e8);
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::dump(&local_210,pbVar5,-1,' ',false,strict);
          std::__cxx11::string::operator=
                    ((string *)&emitter->extensions_json_string,(string *)&local_210);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_210._M_dataplus._M_p != paVar9) {
            operator_delete(local_210._M_dataplus._M_p);
          }
        }
        local_1d8[0]._M_allocated_capacity._0_5_ = 0;
        local_1d8[0]._M_local_buf[5] = '\0';
        local_1d8[0]._M_local_buf[6] = '\0';
        local_1e8._0_8_ = (pointer)0x0;
        local_1e8._8_8_ = (object_t *)0x0;
        local_1d8[0]._7_4_ = 0;
        local_1d8[0]._M_local_buf[0xb] = '\0';
        local_1d8[0]._M_local_buf[0xc] = '\0';
        local_1d8[0]._M_local_buf[0xd] = '\0';
        local_1d8[0]._M_local_buf[0xe] = '\0';
        local_1d8[0]._M_local_buf[0xf] = -0x80;
        bVar3 = detail::FindMember(o,"extras",(json_const_iterator *)local_1e8);
        if (bVar3) {
          pbVar5 = nlohmann::detail::
                   iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                   ::operator*((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                *)local_1e8);
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::dump(&local_210,pbVar5,-1,' ',false,strict);
          std::__cxx11::string::operator=
                    ((string *)&emitter->extras_json_string,(string *)&local_210);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_210._M_dataplus._M_p != paVar9) {
            operator_delete(local_210._M_dataplus._M_p);
            return true;
          }
          return true;
        }
        return true;
      }
      return true;
    }
    local_58.m_it.array_iterator._M_current =
         (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          *)0x0;
    local_58.m_object = (pointer)0x0;
    local_58.m_it.object_iterator._M_node = (_Base_ptr)0x0;
    local_58.m_it.primitive_iterator.m_it = -0x8000000000000000;
    bVar3 = detail::FindMember(o,"positional",&local_58);
    cVar2 = (char)poVar1;
    if (bVar3) {
      psVar6 = (string *)
               nlohmann::detail::
               iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               ::operator*(&local_58);
      if (*(char *)&(psVar6->_M_dataplus)._M_p == '\x01') {
        local_1d8[0]._M_allocated_capacity._0_5_ = 0x49656e6f63;
        local_1d8[0]._M_local_buf[5] = 'n';
        local_1d8[0]._M_local_buf[6] = 'n';
        local_1d8[0]._7_4_ = 0x6e417265;
        local_1d8[0]._M_local_buf[0xb] = 'g';
        local_1d8[0]._M_local_buf[0xc] = 'l';
        local_1d8[0]._M_local_buf[0xd] = 'e';
        local_1e8._8_8_ = 0xe;
        local_1d8[0]._M_local_buf[0xe] = '\0';
        local_210._M_string_length = 0;
        local_210.field_2._M_local_buf[0] = '\0';
        local_210._M_dataplus._M_p = (pointer)paVar9;
        local_1e8._0_8_ = poVar1;
        ParseNumberProperty(&(emitter->positional).coneInnerAngle,err,(json *)psVar6,
                            (string *)local_1e8,false,&local_210);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_210._M_dataplus._M_p != paVar9) {
          operator_delete(local_210._M_dataplus._M_p);
        }
        if ((ostream *)local_1e8._0_8_ != poVar1) {
          operator_delete((void *)local_1e8._0_8_);
        }
        local_1d8[0]._M_allocated_capacity._0_5_ = 0x4f656e6f63;
        local_1d8[0]._M_local_buf[5] = 'u';
        local_1d8[0]._M_local_buf[6] = 't';
        local_1d8[0]._7_4_ = 0x6e417265;
        local_1d8[0]._M_local_buf[0xb] = 'g';
        local_1d8[0]._M_local_buf[0xc] = 'l';
        local_1d8[0]._M_local_buf[0xd] = 'e';
        local_1e8._8_8_ = 0xe;
        local_1d8[0]._M_local_buf[0xe] = '\0';
        local_210._M_string_length = 0;
        local_210.field_2._M_local_buf[0] = '\0';
        local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
        local_1e8._0_8_ = poVar1;
        ParseNumberProperty(&(emitter->positional).coneOuterAngle,err,(json *)psVar6,
                            (string *)local_1e8,false,&local_210);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_210._M_dataplus._M_p != &local_210.field_2) {
          operator_delete(local_210._M_dataplus._M_p);
        }
        poVar1 = (ostream *)(local_1e8 + 0x10);
        if ((ostream *)local_1e8._0_8_ != poVar1) {
          operator_delete((void *)local_1e8._0_8_);
        }
        local_1d8[0]._M_allocated_capacity._0_5_ = 0x4f656e6f63;
        local_1d8[0]._M_local_buf[5] = 'u';
        local_1d8[0]._M_local_buf[6] = 't';
        local_1d8[0]._7_4_ = 0x61477265;
        local_1d8[0]._M_local_buf[0xb] = 'i';
        local_1d8[0]._M_local_buf[0xc] = 'n';
        local_1e8._8_8_ = 0xd;
        local_1d8[0]._M_local_buf[0xd] = '\0';
        paVar9 = &local_210.field_2;
        local_210._M_string_length = 0;
        local_210.field_2._M_local_buf[0] = '\0';
        local_210._M_dataplus._M_p = (pointer)paVar9;
        local_1e8._0_8_ = poVar1;
        ParseNumberProperty(&(emitter->positional).coneOuterGain,err,(json *)psVar6,
                            (string *)local_1e8,false,&local_210);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_210._M_dataplus._M_p != paVar9) {
          operator_delete(local_210._M_dataplus._M_p);
        }
        if ((ostream *)local_1e8._0_8_ != poVar1) {
          operator_delete((void *)local_1e8._0_8_);
        }
        local_1d8[0]._M_allocated_capacity._0_5_ = 0x694478616d;
        local_1d8[0]._M_local_buf[5] = 's';
        local_1d8[0]._M_local_buf[6] = 't';
        local_1d8[0]._7_4_ = 0x65636e61;
        local_1e8._8_8_ = 0xb;
        local_1d8[0]._M_local_buf[0xb] = '\0';
        local_210._M_string_length = 0;
        local_210.field_2._M_local_buf[0] = '\0';
        local_210._M_dataplus._M_p = (pointer)paVar9;
        local_1e8._0_8_ = poVar1;
        ParseNumberProperty(&(emitter->positional).maxDistance,err,(json *)psVar6,
                            (string *)local_1e8,false,&local_210);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_210._M_dataplus._M_p != paVar9) {
          operator_delete(local_210._M_dataplus._M_p);
        }
        if ((ostream *)local_1e8._0_8_ != poVar1) {
          operator_delete((void *)local_1e8._0_8_);
        }
        local_1d8[0]._M_allocated_capacity._0_5_ = 0x6944666572;
        local_1d8[0]._M_local_buf[5] = 's';
        local_1d8[0]._M_local_buf[6] = 't';
        local_1d8[0]._7_4_ = 0x65636e61;
        local_1e8._8_8_ = 0xb;
        local_1d8[0]._M_local_buf[0xb] = '\0';
        local_210._M_string_length = 0;
        local_210.field_2._M_local_buf[0] = '\0';
        local_210._M_dataplus._M_p = (pointer)paVar9;
        local_1e8._0_8_ = poVar1;
        ParseNumberProperty(&(emitter->positional).refDistance,err,(json *)psVar6,
                            (string *)local_1e8,false,&local_210);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_210._M_dataplus._M_p != paVar9) {
          operator_delete(local_210._M_dataplus._M_p);
        }
        if ((ostream *)local_1e8._0_8_ != poVar1) {
          operator_delete((void *)local_1e8._0_8_);
        }
        local_1d8[0]._M_allocated_capacity._0_5_ = 0x6f6c6c6f72;
        local_1d8[0]._M_local_buf[5] = 'f';
        local_1d8[0]._M_local_buf[6] = 'f';
        local_1d8[0]._7_4_ = 0x74636146;
        local_1d8[0]._M_local_buf[0xb] = 'o';
        local_1d8[0]._M_local_buf[0xc] = 'r';
        local_1e8._8_8_ = 0xd;
        local_1d8[0]._M_local_buf[0xd] = '\0';
        local_210._M_string_length = 0;
        local_210.field_2._M_local_buf[0] = '\0';
        local_210._M_dataplus._M_p = (pointer)paVar9;
        local_1e8._0_8_ = poVar1;
        ParseNumberProperty(&(emitter->positional).rolloffFactor,err,(json *)psVar6,
                            (string *)local_1e8,false,&local_210);
        pjVar7 = extraout_RDX_02;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_210._M_dataplus._M_p != paVar9) {
          operator_delete(local_210._M_dataplus._M_p);
          pjVar7 = extraout_RDX_03;
        }
        if ((ostream *)local_1e8._0_8_ != poVar1) {
          operator_delete((void *)local_1e8._0_8_);
          pjVar7 = extraout_RDX_04;
        }
        ParseExtensionsProperty(&(emitter->positional).extensions,psVar6,pjVar7);
        ParseExtrasProperty(&(emitter->positional).extras,(json *)psVar6);
        if ((char)local_1ec != '\0') {
          local_1d8[0]._M_allocated_capacity._0_5_ = 0;
          local_1d8[0]._M_local_buf[5] = '\0';
          local_1d8[0]._M_local_buf[6] = '\0';
          local_1e8._0_8_ = (pointer)0x0;
          local_1e8._8_8_ = (object_t *)0x0;
          local_1d8[0]._7_4_ = 0;
          local_1d8[0]._M_local_buf[0xb] = '\0';
          local_1d8[0]._M_local_buf[0xc] = '\0';
          local_1d8[0]._M_local_buf[0xd] = '\0';
          local_1d8[0]._M_local_buf[0xe] = '\0';
          local_1d8[0]._M_local_buf[0xf] = -0x80;
          bVar3 = detail::FindMember((json *)psVar6,"extensions",(json_const_iterator *)local_1e8);
          if (bVar3) {
            pbVar5 = nlohmann::detail::
                     iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                     ::operator*((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                  *)local_1e8);
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::dump(&local_210,pbVar5,-1,' ',false,strict);
            std::__cxx11::string::operator=
                      ((string *)&(emitter->positional).extensions_json_string,(string *)&local_210)
            ;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_210._M_dataplus._M_p != &local_210.field_2) {
              operator_delete(local_210._M_dataplus._M_p);
            }
          }
          local_1d8[0]._M_allocated_capacity._0_5_ = 0;
          local_1d8[0]._M_local_buf[5] = '\0';
          local_1d8[0]._M_local_buf[6] = '\0';
          local_1e8._0_8_ = (pointer)0x0;
          local_1e8._8_8_ = (object_t *)0x0;
          local_1d8[0]._7_4_ = 0;
          local_1d8[0]._M_local_buf[0xb] = '\0';
          local_1d8[0]._M_local_buf[0xc] = '\0';
          local_1d8[0]._M_local_buf[0xd] = '\0';
          local_1d8[0]._M_local_buf[0xe] = '\0';
          local_1d8[0]._M_local_buf[0xf] = -0x80;
          bVar3 = detail::FindMember((json *)psVar6,"extras",(json_const_iterator *)local_1e8);
          if (bVar3) {
            pbVar5 = nlohmann::detail::
                     iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                     ::operator*((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                  *)local_1e8);
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::dump(&local_210,pbVar5,-1,' ',false,strict);
            std::__cxx11::string::operator=
                      ((string *)&(emitter->positional).extras_json_string,(string *)&local_210);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_210._M_dataplus._M_p != &local_210.field_2) {
              operator_delete(local_210._M_dataplus._M_p);
            }
          }
        }
        goto LAB_0011c20d;
      }
      if (err == (string *)0x0) {
        return false;
      }
      std::__cxx11::stringstream::stringstream((stringstream *)local_1e8);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar1,"\"positional\" is not a JSON object.",0x22);
      std::ios::widen((char)*(undefined8 *)
                             (CONCAT17(local_1d8[0]._M_local_buf[7],
                                       CONCAT16(local_1d8[0]._M_local_buf[6],
                                                CONCAT15(local_1d8[0]._M_local_buf[5],
                                                         (undefined5)
                                                         local_1d8[0]._M_allocated_capacity))) +
                             -0x18) + cVar2);
      std::ostream::put(cVar2);
      std::ostream::flush();
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::_M_append((char *)err,(ulong)local_210._M_dataplus._M_p);
    }
    else {
      if (err == (string *)0x0) {
        return false;
      }
      std::__cxx11::stringstream::stringstream((stringstream *)local_1e8);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar1,"Positional emitter description not found.",0x29);
      std::ios::widen((char)*(undefined8 *)
                             (CONCAT17(local_1d8[0]._M_local_buf[7],
                                       CONCAT16(local_1d8[0]._M_local_buf[6],
                                                CONCAT15(local_1d8[0]._M_local_buf[5],
                                                         (undefined5)
                                                         local_1d8[0]._M_allocated_capacity))) +
                             -0x18) + cVar2);
      std::ostream::put(cVar2);
      std::ostream::flush();
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::_M_append((char *)err,(ulong)local_210._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p != paVar9) {
      operator_delete(local_210._M_dataplus._M_p);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1e8);
    std::ios_base::~ios_base(local_168);
  }
  return false;
}

Assistant:

static bool ParseAudioEmitter(
    AudioEmitter *emitter, std::string *err, const detail::json &o,
    bool store_original_json_for_extras_and_extensions) {
  if (!ParseStringProperty(&emitter->type, err, o, "type", true)) {
    return false;
  }

  if (emitter->type == "positional") {
    detail::json_const_iterator positionalIt;
    if (!detail::FindMember(o, "positional", positionalIt)) {
      if (err) {
        std::stringstream ss;
        ss << "Positional emitter description not found." << std::endl;
        (*err) += ss.str();
      }
      return false;
    }

    const detail::json &v = detail::GetValue(positionalIt);
    if (!detail::IsObject(v)) {
      if (err) {
        std::stringstream ss;
        ss << "\"positional\" is not a JSON object." << std::endl;
        (*err) += ss.str();
      }
      return false;
    }

    if (!ParsePositionalEmitter(
            &emitter->positional, err, v,
            store_original_json_for_extras_and_extensions)) {
      return false;
    }
  }

  ParseStringProperty(&emitter->name, err, o, "name", false);
  ParseNumberProperty(&emitter->gain, err, o, "gain", false);
  ParseBooleanProperty(&emitter->loop, err, o, "loop", false);
  ParseBooleanProperty(&emitter->playing, err, o, "playing", false);
  ParseStringProperty(&emitter->distanceModel, err, o, "distanceModel", false);
  ParseIntegerProperty(&emitter->source, err, o, "source", true);

  ParseExtrasAndExtensions(emitter, err, o,
                           store_original_json_for_extras_and_extensions);

  return true;
}